

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::initiatorFixtureLogOn_RefreshOnLogonHelper::
initiatorFixtureLogOn_RefreshOnLogonHelper
          (initiatorFixtureLogOn_RefreshOnLogonHelper *this,TestDetails *details)

{
  TestDetails *details_local;
  initiatorFixtureLogOn_RefreshOnLogonHelper *this_local;
  
  initiatorFixture::initiatorFixture(&this->super_initiatorFixture);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__initiatorFixtureLogOn_RefreshOnLogonHelper_004636a8;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application =
       (_func_int **)&PTR__initiatorFixtureLogOn_RefreshOnLogonHelper_00463700;
  this->m_details = details;
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LogOn_RefreshOnLogon) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);

  UtcTimeStamp time;
  object->setRefreshOnLogon(true);

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  CHECK(object->isLoggedOn());
}